

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EEFundamentalParameterData.h
# Opt level: O2

void __thiscall
DIS::ElectromagneticEmissionBeamData::setFundamentalParameterData
          (ElectromagneticEmissionBeamData *this,EEFundamentalParameterData *pX)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  (this->_fundamentalParameterData)._pulseWidth = pX->_pulseWidth;
  fVar1 = pX->_frequencyRange;
  fVar2 = pX->_effectiveRadiatedPower;
  fVar3 = pX->_pulseRepetitionFrequency;
  (this->_fundamentalParameterData)._frequency = pX->_frequency;
  (this->_fundamentalParameterData)._frequencyRange = fVar1;
  (this->_fundamentalParameterData)._effectiveRadiatedPower = fVar2;
  (this->_fundamentalParameterData)._pulseRepetitionFrequency = fVar3;
  return;
}

Assistant:

class OPENDIS7_EXPORT EEFundamentalParameterData
{
protected:
  /** center frequency of the emission in hertz. */
  float _frequency; 

  /** Bandwidth of the frequencies corresponding to the fequency field. */
  float _frequencyRange; 

  /** Effective radiated power for the emission in DdBm. For a radar noise jammer, indicates the peak of the transmitted power. */
  float _effectiveRadiatedPower; 

  /** Average repetition frequency of the emission in hertz. */
  float _pulseRepetitionFrequency; 

  /** Average pulse width  of the emission in microseconds. */
  float _pulseWidth; 


 public:
    EEFundamentalParameterData();
    virtual ~EEFundamentalParameterData();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    float getFrequency() const; 
    void setFrequency(float pX); 

    float getFrequencyRange() const; 
    void setFrequencyRange(float pX); 

    float getEffectiveRadiatedPower() const; 
    void setEffectiveRadiatedPower(float pX); 

    float getPulseRepetitionFrequency() const; 
    void setPulseRepetitionFrequency(float pX); 

    float getPulseWidth() const; 
    void setPulseWidth(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const EEFundamentalParameterData& rhs) const;
}